

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O0

qsizetype lastIndexof_helper<QStringView>
                    (QStringList *that,QStringView needle,qsizetype from,CaseSensitivity cs)

{
  long lVar1;
  QStringView other;
  int iVar2;
  qsizetype qVar3;
  QStringView *in_RCX;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  QStringView *in_stack_ffffffffffffff98;
  QList<QString> *in_stack_ffffffffffffffa0;
  QStringView *in_stack_ffffffffffffffa8;
  QStringView *pQVar4;
  QStringView *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)in_RCX < 0) {
    qVar3 = QList<QString>::size(in_RDI);
    local_30 = (QStringView *)((long)&((DataPointer *)&in_RCX->m_size)->d + qVar3);
    in_RCX = in_stack_ffffffffffffffa8;
    pQVar4 = local_30;
  }
  else {
    local_30 = in_RCX;
    qVar3 = QList<QString>::size(in_RDI);
    pQVar4 = local_30;
    if (qVar3 <= (long)in_RCX) {
      qVar3 = QList<QString>::size(in_RDI);
      local_30 = (QStringView *)(qVar3 + -1);
      pQVar4 = local_30;
    }
  }
  for (; -1 < (long)local_30; local_30 = (QStringView *)((long)&local_30[-1].m_data + 7)) {
    QList<QString>::at(in_stack_ffffffffffffffa0,(qsizetype)in_stack_ffffffffffffff98);
    QStringView::QStringView<QString,_true>(local_30,(QString *)in_RCX);
    other.m_data = (storage_type_conflict *)in_RDI;
    other.m_size = (qsizetype)pQVar4;
    iVar2 = QStringView::compare(in_stack_ffffffffffffff98,other,CaseInsensitive);
    if (iVar2 == 0) goto LAB_0054e8b5;
  }
  local_30 = (QStringView *)0xffffffffffffffff;
LAB_0054e8b5:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (qsizetype)local_30;
}

Assistant:

qsizetype lastIndexof_helper(const QStringList &that, String needle, qsizetype from,
                             Qt::CaseSensitivity cs)
{
    if (from < 0)
        from += that.size();
    else if (from >= that.size())
        from = that.size() - 1;

     for (qsizetype i = from; i >= 0; --i) {
        if (needle.compare(that.at(i), cs) == 0)
            return i;
    }

    return -1;
}